

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cc
# Opt level: O1

bool __thiscall RaptorClientAdapter::Connect(RaptorClientAdapter *this,char *addr,size_t timeout_ms)

{
  raptor_error e;
  undefined1 local_30 [24];
  IProtocol local_18 [2];
  
  raptor::TcpClient::Connect
            ((TcpClient *)local_30,
             (char *)(this->_impl).super___shared_ptr<raptor::TcpClient,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(size_t)addr);
  if ((Status *)local_30._0_8_ != (Status *)0x0) {
    raptor::Status::ToString_abi_cxx11_((string *)(local_30 + 8),(Status *)local_30._0_8_);
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/adapter.cc"
               ,0xa8,kLogLevelError,"server adapter: connect (%s)",local_30._8_8_);
    if ((IProtocol *)local_30._8_8_ != local_18) {
      operator_delete((void *)local_30._8_8_);
    }
  }
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_30);
  return (Status *)local_30._0_8_ == (Status *)0x0;
}

Assistant:

bool RaptorClientAdapter::Connect(const char* addr, size_t timeout_ms) {
    raptor_error e = _impl->Connect(addr, timeout_ms);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server adapter: connect (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}